

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O2

size_t __thiscall lattice::supercell::offset2lcord(supercell *this,offset_t *offset)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  
  sVar3 = this->dim_;
  sVar2 = 0;
  while (bVar4 = sVar3 != 0, sVar3 = sVar3 - 1, bVar4) {
    lVar1 = (this->nmin_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
            m_data[sVar3];
    sVar2 = ((offset->super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>).m_storage.m_data
             [sVar3] - lVar1) +
            ((this->nmax_).super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.m_storage.
             m_data[sVar3] - lVar1) * sVar2;
  }
  return sVar2;
}

Assistant:

std::size_t offset2lcord(const offset_t& offset) const {
    std::size_t lc = 0;
    for (std::size_t m = dim_; m > 0; --m) {
      lc *= (nmax_(m-1) - nmin_(m-1));
      lc += (offset(m-1) - nmin_(m-1));
    }
    return lc;
  }